

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

Abc_Cex_t * Bmc_CexEssentialBits(Gia_Man_t *p,Abc_Cex_t *pCexState,Abc_Cex_t *pCexCare,int fVerbose)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  Abc_Cex_t *pAVar5;
  uint iBit;
  int fEqual;
  Abc_Cex_t *pPrev;
  int local_60;
  int local_5c;
  Abc_Cex_t *local_58;
  Abc_Cex_t *local_50;
  Abc_Cex_t *local_48;
  Abc_Cex_t *local_40;
  Abc_Cex_t *local_38;
  
  local_38 = (Abc_Cex_t *)0x0;
  local_60 = 0;
  local_5c = fVerbose;
  if (pCexState->nBits != pCexCare->nBits) {
    __assert_fail("pCexState->nBits == pCexCare->nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                  ,0x2f8,
                  "Abc_Cex_t *Bmc_CexEssentialBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, int)");
  }
  local_48 = Abc_CexAlloc(0,p->vCis->nSize,pCexState->iFrame + 1);
  bVar3 = false;
  iVar2 = pCexState->iFrame;
  local_48->iPo = pCexState->iPo;
  local_48->iFrame = iVar2;
  if (0 < pCexState->nBits) {
    pAVar5 = (Abc_Cex_t *)0x0;
    iBit = 0;
    local_58 = pCexCare;
    local_50 = pCexState;
    do {
      if (((uint)(&pCexCare[1].iPo)[iBit >> 5] >> (iBit & 0x1f) & 1) == 0) goto LAB_0052ba57;
      bVar4 = bVar3;
      if ((int)iBit % pCexCare->nPis < p->vCis->nSize - p->nRegs) {
        local_40 = pAVar5;
        pAVar5 = Bmc_CexEssentialBitOne(p,pCexState,iBit,pAVar5,&local_60);
        if (pAVar5 == (Abc_Cex_t *)0x0) {
          pCexCare = local_58;
          pCexState = local_50;
          pAVar5 = local_40;
          bVar4 = true;
          if (local_60 != 0 && bVar3) goto LAB_0052ba4a;
        }
        else {
          Abc_CexFree(local_40);
          uVar1 = local_50->iPo;
          iVar2 = p->vCos->nSize;
          local_38 = pAVar5;
          if (iVar2 - p->nRegs <= (int)uVar1) {
            __assert_fail("v < Gia_ManPoNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
          }
          if (((int)uVar1 < 0) || (iVar2 <= (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = p->vCos->pArray[uVar1];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          bVar3 = false;
          pCexCare = local_58;
          pCexState = local_50;
          bVar4 = true;
          if ((p->pObjs[iVar2].field_0x7 & 0x40) == 0) goto LAB_0052ba4a;
        }
      }
      else {
LAB_0052ba4a:
        (&local_48[1].iPo)[iBit >> 5] = (&local_48[1].iPo)[iBit >> 5] | 1 << ((byte)iBit & 0x1f);
        bVar3 = bVar4;
      }
LAB_0052ba57:
      iBit = iBit + 1;
    } while ((int)iBit < pCexState->nBits);
  }
  Abc_CexFreeP(&local_38);
  printf("Essentials:   ");
  pAVar5 = local_48;
  Bmc_CexPrint(local_48,p->vCis->nSize - p->nRegs,local_5c);
  return pAVar5;
}

Assistant:

Abc_Cex_t * Bmc_CexEssentialBits( Gia_Man_t * p, Abc_Cex_t * pCexState, Abc_Cex_t * pCexCare, int fVerbose )
{
    Abc_Cex_t * pNew, * pTemp, * pPrev = NULL;
    int b, fEqual = 0, fPrevStatus = 0;
//    abctime clk = Abc_Clock();
    assert( pCexState->nBits == pCexCare->nBits );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // iterate through care-bits
    for ( b = 0; b < pCexState->nBits; b++ )
    {
        // skip don't-care bits
        if ( !Abc_InfoHasBit(pCexCare->pData, b) )
            continue;

        // skip state bits
        if ( b % pCexCare->nPis >= Gia_ManPiNum(p) )
        {
            Abc_InfoSetBit( pNew->pData, b );
            continue;
        }

        // check if this is an essential bit
        pTemp = Bmc_CexEssentialBitOne( p, pCexState, b, pPrev, &fEqual );
//        pTemp = Bmc_CexEssentialBitOne( p, pCexState, b, NULL, &fEqual );
        if ( pTemp == NULL )
        {
            if ( fEqual && fPrevStatus )
                Abc_InfoSetBit( pNew->pData, b );
            continue;
        }
//        Bmc_CexPrint( pTemp, Gia_ManPiNum(p), fVerbose );
        Abc_CexFree( pPrev );
        pPrev = pTemp;

        // record essential bit
        fPrevStatus = !Gia_ManPo(p, pCexState->iPo)->fMark1;
        if ( !Gia_ManPo(p, pCexState->iPo)->fMark1 )
            Abc_InfoSetBit( pNew->pData, b );
    }
    Abc_CexFreeP( &pPrev );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    printf( "Essentials:   " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    return pNew;
}